

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O3

Int128 Omega_h::int128_sum(Reals *a,double unit)

{
  int *piVar1;
  ulong uVar2;
  ulong uVar3;
  Alloc *this;
  ulong uVar4;
  Alloc *this_00;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  Int128 IVar9;
  
  this = (a->write_).shared_alloc_.alloc;
  if (((ulong)this & 1) == 0) {
    uVar2 = this->size;
    if ((uVar2 & 0x7fffffff8) != 0) {
LAB_002021a1:
      if (((ulong)this & 7) == 0 && this != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          this = (Alloc *)(this->size * 8 + 1);
        }
        else {
          this->use_count = this->use_count + 1;
        }
      }
      bVar8 = ((ulong)this & 7) == 0;
      this_00 = this;
      if (bVar8 && this != (Alloc *)0x0) {
        this_00 = (Alloc *)(this->size * 8 + 1);
      }
      entering_parallel = '\0';
      if ((uVar2 & 0x7fffffff8) == 0) {
        lVar5 = 0;
        uVar6 = 0;
      }
      else {
        uVar3 = 0;
        uVar6 = 0;
        lVar5 = 0;
        do {
          uVar4 = (ulong)(*(double *)((long)(a->write_).shared_alloc_.direct_ptr + uVar3 * 8) / unit
                         );
          bVar7 = CARRY8(uVar6,uVar4);
          uVar6 = uVar6 + uVar4;
          lVar5 = lVar5 + ((long)uVar4 >> 0x3f) + (ulong)bVar7;
          uVar3 = uVar3 + 1;
        } while ((uVar2 >> 3 & 0xffffffff) != uVar3);
      }
      if (((ulong)this_00 & 7) == 0 && this_00 != (Alloc *)0x0) {
        piVar1 = &this_00->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(this_00);
          operator_delete(this_00,0x48);
        }
      }
      if (bVar8 && this != (Alloc *)0x0) {
        piVar1 = &this->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(this);
          operator_delete(this,0x48);
        }
      }
      goto LAB_00202296;
    }
  }
  else if ((int)((ulong)this >> 6) != 0) {
    uVar2 = (ulong)this >> 3;
    goto LAB_002021a1;
  }
  lVar5 = 0;
  uVar6 = 0;
LAB_00202296:
  IVar9.low = uVar6;
  IVar9.high = lVar5;
  return IVar9;
}

Assistant:

Int128 int128_sum(Reals const a, double const unit) {
  if (a.size() == 0) {
    return Int128(0);
  }
  auto const first = IntIterator(0);
  auto const last = IntIterator(a.size());
  auto const init = Int128(0);
  auto const op = Int128Plus();
  auto transform = OMEGA_H_LAMBDA(LO i)->Int128 {
    return Int128::from_double(a[i], unit);
  };
  return transform_reduce(first, last, init, op, std::move(transform));
}